

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Request_Metrics(FT_Face face,FT_Size_Request req)

{
  FT_Size pFVar1;
  FT_Size_Metrics *metrics_00;
  FT_Long FVar2;
  long lVar3;
  long lVar4;
  FT_Long local_60;
  FT_Long local_58;
  FT_Long local_48;
  FT_Long scaled_h;
  FT_Long scaled_w;
  FT_Long h;
  FT_Long w;
  FT_Size_Metrics *metrics;
  FT_Error error;
  FT_Size_Request req_local;
  FT_Face face_local;
  
  metrics._4_4_ = 0;
  pFVar1 = face->size;
  metrics_00 = &pFVar1->metrics;
  if ((face->face_flags & 1U) == 0) {
    memset(metrics_00,0,0x38);
    (pFVar1->metrics).x_scale = 0x10000;
    (pFVar1->metrics).y_scale = 0x10000;
    return 0;
  }
  h = 0;
  scaled_w = 0;
  scaled_h = 0;
  local_48 = 0;
  switch(req->type) {
  case FT_SIZE_REQUEST_TYPE_NOMINAL:
    scaled_w = (FT_Long)face->units_per_EM;
    h = scaled_w;
    break;
  case FT_SIZE_REQUEST_TYPE_REAL_DIM:
    scaled_w = (FT_Long)((int)face->ascender - (int)face->descender);
    h = scaled_w;
    break;
  case FT_SIZE_REQUEST_TYPE_BBOX:
    h = (face->bbox).xMax - (face->bbox).xMin;
    scaled_w = (face->bbox).yMax - (face->bbox).yMin;
    break;
  case FT_SIZE_REQUEST_TYPE_CELL:
    h = (FT_Long)face->max_advance_width;
    scaled_w = (FT_Long)((int)face->ascender - (int)face->descender);
    break;
  case FT_SIZE_REQUEST_TYPE_SCALES:
    (pFVar1->metrics).x_scale = req->width;
    (pFVar1->metrics).y_scale = req->height;
    if ((pFVar1->metrics).x_scale == 0) {
      (pFVar1->metrics).x_scale = (pFVar1->metrics).y_scale;
    }
    else if ((pFVar1->metrics).y_scale == 0) {
      (pFVar1->metrics).y_scale = (pFVar1->metrics).x_scale;
    }
    goto LAB_002daf8b;
  case FT_SIZE_REQUEST_TYPE_MAX:
  }
  if (h < 0) {
    h = -h;
  }
  if (scaled_w < 0) {
    scaled_w = -scaled_w;
  }
  if (req->horiResolution == 0) {
    local_58 = req->width;
  }
  else {
    local_58 = (long)(req->width * (ulong)req->horiResolution + 0x24) / 0x48;
  }
  scaled_h = local_58;
  if (req->vertResolution == 0) {
    local_60 = req->height;
  }
  else {
    local_60 = (long)(req->height * (ulong)req->vertResolution + 0x24) / 0x48;
  }
  local_48 = local_60;
  if ((req->height != 0) || (req->width == 0)) {
    if (scaled_w == 0) {
      return 0x85;
    }
    FVar2 = FT_DivFix(local_60,scaled_w);
    (pFVar1->metrics).y_scale = FVar2;
  }
  if (req->width == 0) {
    (pFVar1->metrics).x_scale = (pFVar1->metrics).y_scale;
    scaled_h = FT_MulDiv(local_60,h,scaled_w);
  }
  else {
    if (h == 0) {
      return 0x85;
    }
    FVar2 = FT_DivFix(local_58,h);
    (pFVar1->metrics).x_scale = FVar2;
  }
  if (req->height == 0) {
    (pFVar1->metrics).y_scale = (pFVar1->metrics).x_scale;
    local_48 = FT_MulDiv(scaled_h,scaled_w,h);
  }
  if (req->type == FT_SIZE_REQUEST_TYPE_CELL) {
    if ((pFVar1->metrics).x_scale < (pFVar1->metrics).y_scale) {
      (pFVar1->metrics).y_scale = (pFVar1->metrics).x_scale;
    }
    else {
      (pFVar1->metrics).x_scale = (pFVar1->metrics).y_scale;
    }
  }
LAB_002daf8b:
  if (req->type != FT_SIZE_REQUEST_TYPE_NOMINAL) {
    scaled_h = FT_MulFix((ulong)face->units_per_EM,(pFVar1->metrics).x_scale);
    local_48 = FT_MulFix((ulong)face->units_per_EM,(pFVar1->metrics).y_scale);
  }
  lVar3 = scaled_h + 0x20 >> 6;
  lVar4 = local_48 + 0x20 >> 6;
  if ((lVar3 < 0x10000) && (lVar4 < 0x10000)) {
    metrics_00->x_ppem = (FT_UShort)lVar3;
    (pFVar1->metrics).y_ppem = (FT_UShort)lVar4;
    ft_recompute_scaled_metrics(face,metrics_00);
  }
  else {
    metrics._4_4_ = 0x17;
  }
  return metrics._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Request_Metrics( FT_Face          face,
                      FT_Size_Request  req )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Size_Metrics*  metrics;


    metrics = &face->size->metrics;

    if ( FT_IS_SCALABLE( face ) )
    {
      FT_Long  w = 0, h = 0, scaled_w = 0, scaled_h = 0;


      switch ( req->type )
      {
      case FT_SIZE_REQUEST_TYPE_NOMINAL:
        w = h = face->units_per_EM;
        break;

      case FT_SIZE_REQUEST_TYPE_REAL_DIM:
        w = h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_BBOX:
        w = face->bbox.xMax - face->bbox.xMin;
        h = face->bbox.yMax - face->bbox.yMin;
        break;

      case FT_SIZE_REQUEST_TYPE_CELL:
        w = face->max_advance_width;
        h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_SCALES:
        metrics->x_scale = (FT_Fixed)req->width;
        metrics->y_scale = (FT_Fixed)req->height;
        if ( !metrics->x_scale )
          metrics->x_scale = metrics->y_scale;
        else if ( !metrics->y_scale )
          metrics->y_scale = metrics->x_scale;
        goto Calculate_Ppem;

      case FT_SIZE_REQUEST_TYPE_MAX:
        break;
      }

      /* to be on the safe side */
      if ( w < 0 )
        w = -w;

      if ( h < 0 )
        h = -h;

      scaled_w = FT_REQUEST_WIDTH ( req );
      scaled_h = FT_REQUEST_HEIGHT( req );

      /* determine scales */
      if ( req->height || !req->width )
      {
        if ( h == 0 )
        {
          FT_ERROR(( "FT_Request_Metrics: Divide by zero\n" ));
          error = FT_ERR( Divide_By_Zero );
          goto Exit;
        }

        metrics->y_scale = FT_DivFix( scaled_h, h );
      }

      if ( req->width )
      {
        if ( w == 0 )
        {
          FT_ERROR(( "FT_Request_Metrics: Divide by zero\n" ));
          error = FT_ERR( Divide_By_Zero );
          goto Exit;
        }

        metrics->x_scale = FT_DivFix( scaled_w, w );
      }
      else
      {
        metrics->x_scale = metrics->y_scale;
        scaled_w = FT_MulDiv( scaled_h, w, h );
      }

      if ( !req->height )
      {
        metrics->y_scale = metrics->x_scale;
        scaled_h = FT_MulDiv( scaled_w, h, w );
      }

      if ( req->type == FT_SIZE_REQUEST_TYPE_CELL )
      {
        if ( metrics->y_scale > metrics->x_scale )
          metrics->y_scale = metrics->x_scale;
        else
          metrics->x_scale = metrics->y_scale;
      }

  Calculate_Ppem:
      /* calculate the ppems */
      if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      {
        scaled_w = FT_MulFix( face->units_per_EM, metrics->x_scale );
        scaled_h = FT_MulFix( face->units_per_EM, metrics->y_scale );
      }

      scaled_w = ( scaled_w + 32 ) >> 6;
      scaled_h = ( scaled_h + 32 ) >> 6;
      if ( scaled_w > (FT_Long)FT_USHORT_MAX ||
           scaled_h > (FT_Long)FT_USHORT_MAX )
      {
        FT_ERROR(( "FT_Request_Metrics: Resulting ppem size too large\n" ));
        error = FT_ERR( Invalid_Pixel_Size );
        goto Exit;
      }

      metrics->x_ppem = (FT_UShort)scaled_w;
      metrics->y_ppem = (FT_UShort)scaled_h;

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      FT_ZERO( metrics );
      metrics->x_scale = 1L << 16;
      metrics->y_scale = 1L << 16;
    }

  Exit:
    return error;
  }